

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,Printer *printer)

{
  FieldGenerator *pFVar1;
  
  io::Printer::Print(printer,vars,"$tmpl$$inline$void $dependent_classname$::clear_$name$() {\n");
  io::Printer::Indent(printer);
  if (*(long *)(field + 0x60) == 0) {
    pFVar1 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar1->_vptr_FieldGenerator[9])(pFVar1,printer);
    if (((*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) &&
        (*(int *)(field + 0x4c) != 3)) && (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\0')) {
      io::Printer::Print(printer,vars,"$this_message$clear_has_$name$();\n");
    }
  }
  else {
    io::Printer::Print(printer,vars,"if ($this_message$has_$name$()) {\n");
    io::Printer::Indent(printer);
    pFVar1 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar1->_vptr_FieldGenerator[9])(pFVar1,printer);
    io::Printer::Print(printer,vars,"$this_message$clear_has_$oneof_name$();\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateFieldClear(const FieldDescriptor* field,
                   const std::map<string, string>& vars,
                   io::Printer* printer) {
  // Generate clear_$name$() (See GenerateFieldAccessorDeclarations and
  // GenerateDependentFieldAccessorDeclarations, $dependent_classname$ is
  // set by the Generate*Definitions functions.)
  printer->Print(vars,
    "$tmpl$"
    "$inline$"
    "void $dependent_classname$::clear_$name$() {\n");

  printer->Indent();

  if (field->containing_oneof()) {
    // Clear this field only if it is the active field in this oneof,
    // otherwise ignore
    printer->Print(vars,
      "if ($this_message$has_$name$()) {\n");
    printer->Indent();
    field_generators_.get(field)
        .GenerateClearingCode(printer);
    printer->Print(vars,
      "$this_message$clear_has_$oneof_name$();\n");
    printer->Outdent();
    printer->Print("}\n");
  } else {
    field_generators_.get(field)
        .GenerateClearingCode(printer);
    if (HasFieldPresence(descriptor_->file())) {
      if (!field->is_repeated() && !field->options().weak()) {
        printer->Print(vars,
                       "$this_message$clear_has_$name$();\n");
      }
    }
  }

  printer->Outdent();
  printer->Print("}\n");
}